

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O2

void google::ShowUsageWithFlagsMatching
               (char *argv0,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *substrings)

{
  FILE *pFVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  CommandLineFlagInfo *extraout_RDX;
  CommandLineFlagInfo *extraout_RDX_00;
  CommandLineFlagInfo *flag;
  byte bVar6;
  string *filename;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> flags;
  string last_filename;
  string local_70;
  string local_50;
  
  pFVar1 = _stdout;
  pcVar4 = Basename(argv0);
  pcVar5 = ProgramUsage();
  fprintf(pFVar1,"%s: %s\n",pcVar4,pcVar5);
  flags.
  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  flags.
  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  flags.
  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAllFlags(&flags);
  last_filename._M_dataplus._M_p = (pointer)&last_filename.field_2;
  last_filename._M_string_length = 0;
  last_filename.field_2._M_local_buf[0] = '\0';
  bVar6 = 1;
  bVar3 = false;
  for (filename = &(flags.
                    super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start)->filename;
      (pointer)(filename + -5) !=
      flags.
      super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish; filename = (string *)&filename[6].field_2) {
    if ((((substrings->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (substrings->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) ||
        (bVar2 = FileMatchesSubstring(filename,substrings), bVar2)) &&
       (bVar2 = std::operator==(filename + -3,kStrippedFlagHelp), !bVar2)) {
      bVar3 = std::operator!=(filename,&last_filename);
      flag = extraout_RDX;
      if (bVar3) {
        Dirname(&local_70,filename);
        Dirname(&local_50,&last_filename);
        bVar3 = std::operator!=(&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        if ((bool)(!bVar3 | bVar6)) {
          bVar6 = bVar6 & !bVar3;
        }
        else {
          fwrite("\n\n",2,1,_stdout);
          bVar6 = 0;
        }
        fprintf(_stdout,"\n  Flags from %s:\n",(filename->_M_dataplus)._M_p);
        std::__cxx11::string::_M_assign((string *)&last_filename);
        flag = extraout_RDX_00;
      }
      pFVar1 = _stdout;
      DescribeOneFlag_abi_cxx11_(&local_70,(google *)(filename + -5),flag);
      fputs(local_70._M_dataplus._M_p,pFVar1);
      std::__cxx11::string::~string((string *)&local_70);
      bVar3 = true;
    }
  }
  if ((!bVar3) &&
     ((substrings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (substrings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    fwrite("\n  No modules matched: use -help\n",0x21,1,_stdout);
  }
  std::__cxx11::string::~string((string *)&last_filename);
  std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::~vector
            (&flags);
  return;
}

Assistant:

static void ShowUsageWithFlagsMatching(const char *argv0,
                                       const vector<string> &substrings) {
  fprintf(stdout, "%s: %s\n", Basename(argv0), ProgramUsage());

  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);           // flags are sorted by filename, then flagname

  string last_filename;          // so we know when we're at a new file
  bool first_directory = true;   // controls blank lines between dirs
  bool found_match = false;      // stays false iff no dir matches restrict
  for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
       flag != flags.end();
       ++flag) {
    if (substrings.empty() ||
        FileMatchesSubstring(flag->filename, substrings)) {
      // If the flag has been stripped, pretend that it doesn't exist.
      if (flag->description == kStrippedFlagHelp) continue;
      found_match = true;     // this flag passed the match!
      if (flag->filename != last_filename) {                      // new file
        if (Dirname(flag->filename) != Dirname(last_filename)) {  // new dir!
          if (!first_directory)
            fprintf(stdout, "\n\n");   // put blank lines between directories
          first_directory = false;
        }
        fprintf(stdout, "\n  Flags from %s:\n", flag->filename.c_str());
        last_filename = flag->filename;
      }
      // Now print this flag
      fprintf(stdout, "%s", DescribeOneFlag(*flag).c_str());
    }
  }
  if (!found_match && !substrings.empty()) {
    fprintf(stdout, "\n  No modules matched: use -help\n");
  }
}